

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

void __thiscall
Inline::GetArgInstrsForCallAndApply
          (Inline *this,Instr *callInstr,Instr **implicitThisArgOut,Instr **explicitThisArgOut,
          Instr **argumentsOrArrayArgOut,uint *argOutCount)

{
  anon_class_56_7_ba743319 callback;
  Opnd *this_00;
  RegOpnd *pRVar1;
  Instr *local_48;
  Instr *argInsertInstr;
  Opnd *linkOpnd;
  uint *argOutCount_local;
  Instr **argumentsOrArrayArgOut_local;
  Instr **explicitThisArgOut_local;
  Instr **implicitThisArgOut_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  linkOpnd = (Opnd *)argOutCount;
  argOutCount_local = (uint *)argumentsOrArrayArgOut;
  argumentsOrArrayArgOut_local = explicitThisArgOut;
  explicitThisArgOut_local = implicitThisArgOut;
  implicitThisArgOut_local = (Instr **)callInstr;
  callInstr_local = (Instr *)this;
  this_00 = IR::Instr::GetSrc2(callInstr);
  argInsertInstr = (Instr *)IR::Opnd::AsSymOpnd(this_00);
  local_48 = (Instr *)implicitThisArgOut_local;
  callback.argumentsOrArrayArgOut = (Instr ***)&argOutCount_local;
  callback.argOutCount = (uint *)linkOpnd;
  callback.explicitThisArgOut = &argumentsOrArrayArgOut_local;
  callback.implicitThisArgOut = &explicitThisArgOut_local;
  callback.linkOpnd = (Opnd **)&argInsertInstr;
  callback.this = this;
  callback.argInsertInstr = &local_48;
  IR::Instr::
  IterateArgInstrs<Inline::GetArgInstrsForCallAndApply(IR::Instr*,IR::Instr**,IR::Instr**,IR::Instr**,unsigned_int&)::__0>
            ((Instr *)implicitThisArgOut_local,callback);
  pRVar1 = IR::Opnd::AsRegOpnd((Opnd *)argInsertInstr);
  *(uint *)&pRVar1->m_sym->field_0x18 = *(uint *)&pRVar1->m_sym->field_0x18 & 0xffffbfff | 0x4000;
  return;
}

Assistant:

void Inline::GetArgInstrsForCallAndApply(IR::Instr* callInstr, IR::Instr** implicitThisArgOut, IR::Instr** explicitThisArgOut, IR::Instr** argumentsOrArrayArgOut, uint &argOutCount)
{
    IR::Opnd * linkOpnd = callInstr->GetSrc2()->AsSymOpnd();
    IR::Instr * argInsertInstr = callInstr;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
        argOutCount++;

        *argumentsOrArrayArgOut = *explicitThisArgOut;
        *explicitThisArgOut = *implicitThisArgOut;
        *implicitThisArgOut = argInstr;

        linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_isInlinedArgSlot = true;
        linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_allocated = true;
        ConvertToInlineBuiltInArgOut(argInstr);

        argInstr->Move(argInsertInstr);
        argInsertInstr = argInstr;

        linkOpnd = argInstr->GetSrc2();
        return false;
    });
    linkOpnd->AsRegOpnd()->m_sym->m_isInlinedArgSlot = true;
}